

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O0

void __thiscall
deqp::TestSubcase::TestSubcase
          (TestSubcase *this,Context *context,char *name,_func_SubcaseBasePtr *factoryFunc)

{
  int iVar1;
  TestContext *this_00;
  CommandLine *this_01;
  _func_SubcaseBasePtr *factoryFunc_local;
  char *name_local;
  Context *context_local;
  TestSubcase *this_local;
  
  deqp::TestCase::TestCase(&this->super_TestCase,context,name,"");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestSubcase_03276e68;
  this->m_factoryFunc = factoryFunc;
  this_00 = deqp::Context::getTestContext(context);
  this_01 = tcu::TestContext::getCommandLine(this_00);
  iVar1 = tcu::CommandLine::getTestIterationCount(this_01);
  this->m_iterationCount = iVar1;
  if (this->m_iterationCount == 0) {
    this->m_iterationCount = 1;
  }
  return;
}

Assistant:

TestSubcase::TestSubcase(Context& context, const char* name, SubcaseBase::SubcaseBasePtr (*factoryFunc)())
	: TestCase(context, name, "")
	, m_factoryFunc(factoryFunc)
	, m_iterationCount(context.getTestContext().getCommandLine().getTestIterationCount())
{
	if (!m_iterationCount)
		m_iterationCount = 1;
}